

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O0

bool __thiscall
Refal2::COperationsExecuter::matchLeftWithQulifierSaveToTable_E
          (COperationsExecuter *this,TQualifierIndex qualifier)

{
  bool bVar1;
  CUnitNode **ppCVar2;
  TQualifierIndex qualifier_local;
  COperationsExecuter *this_local;
  
  bVar1 = shiftLeft(this);
  if ((bVar1) && (bVar1 = checkQualifier(this,this->left,qualifier), bVar1)) {
    bVar1 = CUnit::IsLeftParen(&this->left->super_CUnit);
    if (bVar1) {
      ppCVar2 = CUnit::PairedParen(&this->left->super_CUnit);
      this->left = *ppCVar2;
    }
    saveState(this);
    this->tableTop = this->tableTop + 1;
    saveToTable(this,this->left);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool COperationsExecuter::matchLeftWithQulifierSaveToTable_E(
	const TQualifierIndex qualifier )
{
	if( shiftLeft() && checkQualifier( left, qualifier ) ) {
		if( left->IsLeftParen() ) {
			left = left->PairedParen();
		}
		saveState();
		tableTop++;
		saveToTable( left );
		return true;
	} else {
		return false;
	}
}